

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O0

void __thiscall SID::write_state(SID *this,State *state)

{
  long in_RSI;
  SID *in_RDI;
  int i;
  int local_14;
  
  for (local_14 = 0; local_14 < 0x19; local_14 = local_14 + 1) {
    write(in_RDI,local_14,(void *)(ulong)(uint)(int)*(char *)(in_RSI + local_14),(long)local_14);
  }
  in_RDI->bus_value = *(reg8 *)(in_RSI + 0x20);
  in_RDI->bus_value_ttl = *(cycle_count *)(in_RSI + 0x24);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    *(undefined4 *)(&in_RDI->field_0x14 + (long)local_14 * 0x90) =
         *(undefined4 *)(in_RSI + 0x28 + (long)local_14 * 4);
    *(undefined4 *)(&in_RDI->field_0x18 + (long)local_14 * 0x90) =
         *(undefined4 *)(in_RSI + 0x34 + (long)local_14 * 4);
    *(undefined4 *)(&in_RDI->field_0x58 + (long)local_14 * 0x90) =
         *(undefined4 *)(in_RSI + 0x40 + (long)local_14 * 4);
    *(undefined4 *)(&in_RDI->field_0x5c + (long)local_14 * 0x90) =
         *(undefined4 *)(in_RSI + 0x4c + (long)local_14 * 4);
    *(undefined4 *)(&in_RDI->field_0x60 + (long)local_14 * 0x90) =
         *(undefined4 *)(in_RSI + 0x58 + (long)local_14 * 4);
    *(undefined4 *)(&in_RDI->field_0x64 + (long)local_14 * 0x90) =
         *(undefined4 *)(in_RSI + 100 + (long)local_14 * 4);
    *(undefined4 *)(&in_RDI->field_0x68 + (long)local_14 * 0x90) =
         *(undefined4 *)(in_RSI + 0x70 + (long)local_14 * 4);
    *(undefined4 *)(&in_RDI->field_0x84 + (long)local_14 * 0x90) =
         *(undefined4 *)(in_RSI + 0x7c + (long)local_14 * 4);
    (&in_RDI->field_0x6c)[(long)local_14 * 0x90] = *(byte *)(in_RSI + 0x88 + (long)local_14) & 1;
  }
  return;
}

Assistant:

void SID::write_state(const State& state)
{
  int i;

  for (i = 0; i <= 0x18; i++) {
    write(i, state.sid_register[i]);
  }

  bus_value = state.bus_value;
  bus_value_ttl = state.bus_value_ttl;

  for (i = 0; i < 3; i++) {
    voice[i].wave.accumulator = state.accumulator[i];
    voice[i].wave.shift_register = state.shift_register[i];
    voice[i].envelope.rate_counter = state.rate_counter[i];
    voice[i].envelope.rate_period = state.rate_counter_period[i];
    voice[i].envelope.exponential_counter = state.exponential_counter[i];
    voice[i].envelope.exponential_counter_period = state.exponential_counter_period[i];
    voice[i].envelope.envelope_counter = state.envelope_counter[i];
    voice[i].envelope.state = state.envelope_state[i];
    voice[i].envelope.hold_zero = state.hold_zero[i];
  }
}